

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

void __thiscall GlobOpt::ProcessFieldKills(GlobOpt *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *instr_local;
  GlobOpt *this_local;
  
  bVar2 = DoFieldCopyProp(this);
  if (((bVar2) || (bVar2 = DoFieldRefOpts(this), bVar2)) || (bVar2 = DoCSE(this), bVar2)) {
    ProcessFieldKills(this,instr,(this->currentBlock->globOptData).liveFields,true);
  }
  else {
    bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                      ((this->currentBlock->globOptData).liveFields);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x25a,"(this->currentBlock->globOptData.liveFields->IsEmpty())",
                         "this->currentBlock->globOptData.liveFields->IsEmpty()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  return;
}

Assistant:

void
GlobOpt::ProcessFieldKills(IR::Instr * instr)
{
    if (!this->DoFieldCopyProp() && !this->DoFieldRefOpts() && !DoCSE())
    {
        Assert(this->currentBlock->globOptData.liveFields->IsEmpty());
        return;
    }

    ProcessFieldKills(instr, this->currentBlock->globOptData.liveFields, true);
}